

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  unsigned_short *puVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImVec2 triangle [3];
  ImVec2 local_e8 [4];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (show_mesh || show_aabb) {
    local_78 = ZEXT416((uint)(draw_cmd->ClipRect).x);
    local_68 = ZEXT416((uint)(draw_cmd->ClipRect).y);
    local_58 = ZEXT416((uint)(draw_cmd->ClipRect).z);
    local_48 = ZEXT416((uint)(draw_cmd->ClipRect).w);
    uVar2 = out_draw_list->Flags;
    out_draw_list->Flags = uVar2 & 0xfffffffe;
    uVar3 = draw_cmd->IdxOffset;
    uVar8 = (ulong)uVar3;
    uVar9 = draw_cmd->ElemCount + uVar3;
    if (uVar3 < uVar9) {
      fVar10 = -3.4028235e+38;
      local_b8._0_4_ = 3.4028235e+38;
      local_c8._0_4_ = 3.4028235e+38;
      fVar14 = -3.4028235e+38;
      do {
        if ((draw_list->IdxBuffer).Size < 1) {
          puVar5 = (unsigned_short *)0x0;
        }
        else {
          puVar5 = (draw_list->IdxBuffer).Data;
        }
        uVar3 = draw_cmd->VtxOffset;
        pIVar4 = (draw_list->VtxBuffer).Data;
        local_e8[0].x = 0.0;
        local_e8[0].y = 0.0;
        local_e8[1].x = 0.0;
        local_e8[1].y = 0.0;
        local_e8[2].x = 0.0;
        local_e8[2].y = 0.0;
        lVar7 = 0;
        do {
          uVar1 = lVar7 + (uVar8 & 0xffffffff);
          uVar6 = (uint)uVar1;
          if (puVar5 != (unsigned_short *)0x0) {
            uVar6 = (uint)puVar5[uVar1 & 0xffffffff];
          }
          local_e8[lVar7] = pIVar4[(ulong)uVar3 + (ulong)uVar6].pos;
          fVar11 = local_e8[lVar7].x;
          fVar12 = local_e8[lVar7].y;
          local_b8._4_4_ = 0.0;
          fStack_b0 = 0.0;
          fStack_ac = 0.0;
          fVar13 = fVar11;
          if ((float)local_b8._0_4_ <= fVar11) {
            fVar13 = (float)local_b8._0_4_;
          }
          local_b8._0_4_ = fVar13;
          local_c8._4_4_ = 0.0;
          fStack_c0 = 0.0;
          fStack_bc = 0.0;
          fVar13 = fVar12;
          if ((float)local_c8._0_4_ <= fVar12) {
            fVar13 = (float)local_c8._0_4_;
          }
          local_c8._0_4_ = fVar13;
          if (fVar11 <= fVar10) {
            fVar11 = fVar10;
          }
          fVar10 = fVar11;
          if (fVar12 <= fVar14) {
            fVar12 = fVar14;
          }
          fVar14 = fVar12;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        fVar11 = 0.0;
        fVar12 = 0.0;
        fVar13 = 0.0;
        fVar15 = 0.0;
        fVar16 = 0.0;
        fVar17 = 0.0;
        if (show_mesh) {
          _local_98 = ZEXT416((uint)fVar10);
          _local_a8 = ZEXT416((uint)fVar14);
          _local_b8 = ZEXT416((uint)local_b8._0_4_);
          _local_c8 = ZEXT416((uint)local_c8._0_4_);
          ImDrawList::AddPolyline(out_draw_list,local_e8,3,0xff00ffff,1,1.0);
          fVar10 = (float)local_98._0_4_;
          fVar11 = (float)local_98._4_4_;
          fVar12 = fStack_90;
          fVar13 = fStack_8c;
          fVar14 = (float)local_a8._0_4_;
          fVar15 = (float)local_a8._4_4_;
          fVar16 = fStack_a0;
          fVar17 = fStack_9c;
        }
        uVar8 = (uVar8 & 0xffffffff) + 3;
      } while ((uint)uVar8 < uVar9);
      local_98._4_4_ = (float)(int)(float)local_b8._4_4_;
      local_98._0_4_ = (float)(int)(float)local_b8._0_4_;
      fStack_90 = (float)(int)fStack_b0;
      fStack_8c = (float)(int)fStack_ac;
      local_b8._4_4_ = (float)(int)(float)local_c8._4_4_;
      local_b8._0_4_ = (float)(int)(float)local_c8._0_4_;
      fStack_b0 = (float)(int)fStack_c0;
      fStack_ac = (float)(int)fStack_bc;
      local_a8._4_4_ = (float)(int)fVar11;
      local_a8._0_4_ = (float)(int)fVar10;
      fStack_a0 = (float)(int)fVar12;
      fStack_9c = (float)(int)fVar13;
      local_c8._4_4_ = (float)(int)fVar15;
      local_c8._0_4_ = (float)(int)fVar14;
      fStack_c0 = (float)(int)fVar16;
      fStack_bc = (float)(int)fVar17;
    }
    if (show_aabb) {
      local_e8[0].y = (float)(int)(float)local_68._0_4_;
      local_e8[0].x = (float)(int)(float)local_78._0_4_;
      local_80.y = (float)(int)(float)local_48._0_4_;
      local_80.x = (float)(int)(float)local_58._0_4_;
      ImDrawList::AddRect(out_draw_list,local_e8,&local_80,0xffff00ff,0.0,0,1.0);
      local_e8[0].y = (float)local_b8._0_4_;
      local_e8[0].x = (float)local_98._0_4_;
      local_80.y = (float)local_c8._0_4_;
      local_80.x = (float)local_a8._0_4_;
      ImDrawList::AddRect(out_draw_list,local_e8,&local_80,0xffffff00,0.0,0,1.0);
    }
    out_draw_list->Flags = uVar2;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x4397,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset, idx_end = draw_cmd->IdxOffset + draw_cmd->ElemCount; idx_n < idx_end; )
    {
        ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL; // We don't hold on those pointers past iterations as ->AddPolyline() may invalidate them if out_draw_list==draw_list
        ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}